

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

void __thiscall
SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
          (SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *this,ArenaAllocator *allocator
          )

{
  Type buffer;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((SListBase<ParseNode_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->super_SListNodeBase<Memory::ArenaAllocator>).next == this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x18b,"(!this->Empty())","!this->Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  buffer = (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  (this->super_SListNodeBase<Memory::ArenaAllocator>).next = buffer->next;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x10);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveHead(TAllocator * allocator)
    {
        Assert(!this->Empty());

        NodeBase * node = this->Next();
        this->Next() = node->Next();

        auto freeFunc = TypeAllocatorFunc<TAllocator, TData>::GetFreeFunc();
        AllocatorFree(allocator, freeFunc, (Node *) node, sizeof(Node));
        this->DecrementCount();
    }